

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *psVar3;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this;
  type tVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  uint arg_id;
  byte *pbVar8;
  basic_format_specs<char> *pbVar9;
  basic_string_view<char> name;
  error_handler local_71;
  width_checker<fmt::v5::internal::error_handler> local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pbVar9 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_68.string,
             (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).context_);
LAB_0011ff82:
    local_38 = local_58;
    uStack_30 = uStack_50;
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    local_70.handler_ = &local_71;
    tVar4 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        *)&local_48.string);
    if ((tVar4 & 0xffffffff80000000) == 0) {
      (pbVar9->super_align_spec).width_ = (uint)tVar4;
      return begin;
    }
    error_handler::on_error(&local_71,"number is too big");
  }
  if ((byte)(bVar1 - 0x30) < 10) {
    begin = begin + 1;
    arg_id = 0;
    pcVar7 = begin;
    if (bVar1 != 0x30) {
      while (arg_id < 0xccccccd) {
        arg_id = ((int)pcVar7[-1] + arg_id * 10) - 0x30;
        begin = end;
        if ((pcVar7 == end) ||
           (cVar2 = *pcVar7, begin = pcVar7, pcVar7 = pcVar7 + 1, 9 < (byte)(cVar2 - 0x30U)))
        goto LAB_001200e2;
      }
      arg_id = 0x80000000;
      begin = pcVar7 + -1;
LAB_001200e2:
      if ((int)arg_id < 0) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"number is too big");
      }
    }
    if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
      psVar3 = handler->handler;
      pbVar9 = (psVar3->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      this = (psVar3->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).context_;
      if (0 < (this->
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
              ).parse_context_.next_arg_id_) {
        error_handler::on_error
                  ((error_handler *)this,"cannot switch from automatic to manual argument indexing")
        ;
      }
      (this->
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ).parse_context_.next_arg_id_ = -1;
      context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ::do_get_arg((format_arg *)&local_68.string,
                   &((psVar3->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_)->
                    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   ,arg_id);
      goto LAB_0011ff82;
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar6 = (byte *)(begin + 1);
    do {
      pbVar5 = pbVar6;
      pbVar8 = (byte *)end;
      if (pbVar5 == (byte *)end) break;
      bVar1 = *pbVar5;
      pbVar6 = pbVar5 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar8 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    name.size_ = (long)pbVar8 - (long)begin;
    pbVar9 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    name.data_ = begin;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_68.string,
            (handler->handler->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            ).context_,name);
    local_38 = local_58;
    uStack_30 = uStack_50;
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    local_70.handler_ = &local_71;
    tVar4 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        *)&local_48.string);
    if ((tVar4 & 0xffffffff80000000) == 0) {
      (pbVar9->super_align_spec).width_ = (uint)tVar4;
      return (char *)pbVar8;
    }
    error_handler::on_error(&local_71,"number is too big");
  }
  error_handler::on_error
            ((error_handler *)
             (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).context_,"invalid format string");
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}